

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerselect.c
# Opt level: O2

int is_valid_character(nh_roles_info *ri,int rolenum,int racenum,int gendnum,int alignnum)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  
  iVar11 = 0;
  iVar3 = ri->num_roles;
  if (ri->num_roles < 1) {
    iVar3 = iVar11;
  }
  iVar8 = 0;
  for (; iVar11 != iVar3; iVar11 = iVar11 + 1) {
    if (rolenum < 0 || iVar11 == rolenum) {
      iVar7 = ri->num_races;
      iVar5 = 0;
      iVar4 = 0;
      if (0 < iVar7) {
        iVar4 = iVar7;
      }
      iVar7 = iVar7 * iVar11;
      for (; iVar5 != iVar4; iVar5 = iVar5 + 1) {
        if (racenum < 0 || iVar5 == racenum) {
          iVar12 = ri->num_genders;
          iVar9 = 0;
          iVar10 = 0;
          if (0 < iVar12) {
            iVar10 = iVar12;
          }
          iVar12 = iVar12 * iVar7;
          for (; iVar9 != iVar10; iVar9 = iVar9 + 1) {
            if (gendnum < 0 || iVar9 == gendnum) {
              uVar1 = ri->num_aligns;
              uVar2 = 0;
              if (0 < (int)uVar1) {
                uVar2 = (ulong)uVar1;
              }
              for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
                if (alignnum < 0 || (uint)alignnum == uVar6) {
                  iVar8 = (iVar8 + 1) -
                          (uint)(ri->matrix[uVar6 + (long)(int)(uVar1 * iVar12)] == '\0');
                }
              }
            }
            iVar12 = iVar12 + 1;
          }
        }
        iVar7 = iVar7 + 1;
      }
    }
  }
  return (int)(0 < iVar8);
}

Assistant:

static int is_valid_character(const struct nh_roles_info *ri, int rolenum,
			      int racenum, int gendnum, int alignnum)
{
    int i, j, k, l, ok;
    
    ok = 0;
    for (i = 0; i < ri->num_roles; i++) {
	if (rolenum > ROLE_NONE && i != rolenum)
	    continue;
	
	for (j = 0; j < ri->num_races; j++) {
	    if (racenum > ROLE_NONE && j != racenum)
		continue;
	    
	    for (k = 0; k < ri->num_genders; k++) {
		if (gendnum > ROLE_NONE && k != gendnum)
		    continue;
		
		for (l = 0; l < ri->num_aligns; l++) {
		    if (alignnum > ROLE_NONE && l != alignnum)
			continue;
		    
		    if (ri->matrix[nh_cm_idx((*ri), i, j, k, l)])
			ok++;
		}
	    }
	}
    }
    
    return ok > 0;
}